

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  long in_FS_OFFSET;
  tm time_struct;
  int local_234;
  tm local_230;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = PortableLocaltime((long)this / 1000,&local_230);
  if (bVar1) {
    local_234 = local_230.tm_year + 0x76c;
    StreamableToString<int>(&local_158,&local_234);
    std::operator+(&local_138,&local_158,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_178,(String *)(ulong)(local_230.tm_mon + 1),value);
    std::operator+(&local_118,&local_138,&local_178);
    std::operator+(&local_f8,&local_118,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_198,(String *)(ulong)(uint)local_230.tm_mday,value_00)
    ;
    std::operator+(&local_d8,&local_f8,&local_198);
    std::operator+(&local_b8,&local_d8,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_1b8,(String *)(ulong)(uint)local_230.tm_hour,value_01)
    ;
    std::operator+(&local_98,&local_b8,&local_1b8);
    std::operator+(&local_78,&local_98,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1d8,(String *)(ulong)(uint)local_230.tm_min,value_02);
    std::operator+(&local_58,&local_78,&local_1d8);
    std::operator+(&local_38,&local_58,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1f8,(String *)(ulong)(uint)local_230.tm_sec,value_03);
    std::operator+(__return_storage_ptr__,&local_38,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}